

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_dl.c
# Opt level: O3

void * dlopen_wrapper(char *filename,int flags)

{
  FILE *__stream;
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  void *pvVar4;
  
  pcVar3 = (code *)gotcha_get_wrappee(orig_dlopen_handle);
  __stream = _stderr;
  if (0 < debug_level) {
    uVar1 = gotcha_gettid();
    uVar2 = getpid();
    fprintf(__stream,"[%d/%d][%s:%u] - User called dlopen(%s, 0x%x)\n",(ulong)uVar1,(ulong)uVar2,
            "gotcha_dl.c",0x28,filename,flags);
  }
  pvVar4 = (void *)(*pcVar3)(filename);
  if (1 < debug_level) {
    dlopen_wrapper_cold_1();
  }
  foreach_hash_entry(&notfound_binding_table,(void *)0x0,per_binding);
  if (1 < debug_level) {
    dlopen_wrapper_cold_2();
  }
  update_all_library_gots(&function_hash_table);
  return pvVar4;
}

Assistant:

static void* dlopen_wrapper(const char* filename, int flags) {
   typeof(&dlopen_wrapper) orig_dlopen = gotcha_get_wrappee(orig_dlopen_handle);
   void *handle;
   debug_printf(1, "User called dlopen(%s, 0x%x)\n", filename, (unsigned int) flags);
   handle = orig_dlopen(filename,flags);

   debug_printf(2, "Searching new dlopened libraries for previously-not-found exports\n");
   foreach_hash_entry(&notfound_binding_table, NULL, per_binding);

   debug_printf(2, "Updating GOT entries for new dlopened libraries\n");
   update_all_library_gots(&function_hash_table);
  
   return handle;
}